

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionGraph::make_rewind_data(InstructionGraph *this,InstructionRewind *rewind)

{
  Instruction *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Vec<Hpipe::InstructionRewind::CodeSeqItem> *pVVar5;
  ulong uVar6;
  Transition *pTVar7;
  size_type sVar8;
  CodeSeqItem *pCVar9;
  undefined4 extraout_var;
  vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_> *pvVar10;
  reference pCVar11;
  long local_430;
  long local_420;
  long local_410;
  long local_400;
  long local_3e0;
  uint local_3cc;
  InstructionWithCode *local_3c0;
  long local_3a0;
  int local_38c;
  InstructionWithCode *local_380;
  InstructionEndStr *es_1;
  InstructionBegStr *bs_1;
  CodeSeqItem *csi_1;
  uint i;
  InstructionEndStr *es;
  InstructionBegStr *bs;
  CodeSeqItem *csi;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::InstructionRewind::CodeSeqItem> *__range1;
  PC local_280;
  anon_class_16_2_79276496 local_1f8;
  function<void_(Hpipe::Instruction_*)> local_1e8;
  long local_1c8;
  InstructionNextChar *nc_1;
  InstructionWithCode *local_1b8;
  InstructionWithCode *wc_1;
  Transition *t_1;
  const_iterator __end3;
  const_iterator __begin3;
  Vec<Hpipe::Transition> *__range3;
  Vec<Hpipe::Transition> *n;
  iterator __end2;
  iterator __begin2;
  Vec<Hpipe::Vec<Hpipe::Transition>_> *__range2;
  Instruction *pIStack_168;
  uint nb_next_rw;
  Instruction *next_rw;
  Instruction *inst_1;
  Context *ncx_beg;
  CodeSeqItem *pCStack_148;
  uint offset_beg;
  CodeSeqItem *item;
  reference pTStack_138;
  uint num_item;
  Transition *t;
  iterator __end7;
  iterator __begin7;
  Vec<Hpipe::Transition> *__range7;
  uint nt;
  bool in [2];
  InstructionNextChar *nc;
  InstructionWithCode *local_100;
  InstructionWithCode *wc;
  Instruction *next;
  Instruction *inst;
  anon_class_8_1_3fcf669a local_d8;
  function<void_(Hpipe::Instruction_*)> local_d0;
  int local_ac;
  Instruction *pIStack_a8;
  uint offset_end;
  InstructionOK *ok;
  InstructionRewind *local_18;
  InstructionRewind *rewind_local;
  InstructionGraph *this_local;
  
  local_18 = rewind;
  rewind_local = (InstructionRewind *)this;
  make_rewind_exec(this,(rewind->super_Instruction).mark,rewind);
  if (local_18->exec == (Instruction *)0x0) {
    Context::without_mark((PC *)&ok,&(local_18->super_Instruction).cx);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=(&local_18->ncx,(type)&ok);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair
              ((pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)&ok);
  }
  else {
    pIStack_a8 = (Instruction *)0x0;
    local_ac = 0;
    pIVar1 = local_18->exec;
    local_d8.ok = (InstructionOK **)&stack0xffffffffffffff58;
    std::function<void(Hpipe::Instruction*)>::
    function<Hpipe::InstructionGraph::make_rewind_data(Hpipe::InstructionRewind*)::__0,void>
              ((function<void(Hpipe::Instruction*)> *)&local_d0,&local_d8);
    Instruction::apply_rw(pIVar1,&local_d0,false);
    std::function<void_(Hpipe::Instruction_*)>::~function(&local_d0);
    if (pIStack_a8 != (Instruction *)0x0) {
      next = pIStack_a8;
      wc = (InstructionWithCode *)0x0;
      while (uVar3 = Instruction::nb_next_rw(next), uVar3 < (next != pIStack_a8) + 1) {
        if (next == (Instruction *)0x0) {
          local_380 = (InstructionWithCode *)0x0;
        }
        else {
          local_380 = (InstructionWithCode *)
                      __dynamic_cast(next,&Instruction::typeinfo,&InstructionWithCode::typeinfo,0);
        }
        local_100 = local_380;
        if (local_380 != (InstructionWithCode *)0x0) {
          sVar8 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::
                  size((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
                       &(local_380->super_Instruction).cx);
          if (1 < sVar8) break;
          pVVar5 = &local_18->code_seq_end;
          uVar3 = (*(local_100->super_Instruction)._vptr_Instruction[0x11])();
          if ((uVar3 & 1) == 0) {
            local_38c = -1;
          }
          else {
            local_38c = local_ac;
          }
          nc._4_4_ = local_38c;
          std::
          vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
          ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>
                    ((vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                      *)pVVar5,(uint *)((long)&nc + 4),&local_100);
          local_100->in_code_seq = true;
        }
        sVar8 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                          (&(next->prev).
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
        if (sVar8 != 1) break;
        if (next == (Instruction *)0x0) {
          local_3a0 = 0;
        }
        else {
          local_3a0 = __dynamic_cast(next,&Instruction::typeinfo,&InstructionNextChar::typeinfo,0);
        }
        _nt = local_3a0;
        if ((local_3a0 != 0) && ((*(byte *)(local_3a0 + 0x174) & 1) == 0)) {
          memset((void *)((long)&__range7 + 6),0,2);
          for (__range7._0_4_ = 0; (uint)__range7 < 2; __range7._0_4_ = (uint)__range7 + 1) {
            uVar6 = (ulong)(uint)__range7;
            sVar8 = std::
                    vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                    ::size((vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                            *)(_nt + 0xf0));
            if (uVar6 < sVar8) {
              pvVar10 = &Vec<Hpipe::Vec<Hpipe::Transition>_>::operator[]
                                   ((Vec<Hpipe::Vec<Hpipe::Transition>_> *)(_nt + 0xf0),
                                    (uint)__range7)->
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>;
              __end7 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                                 (pvVar10);
              t = (Transition *)
                  std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end(pvVar10);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end7,(__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                                                 *)&t), bVar2) {
                pTStack_138 = __gnu_cxx::
                              __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                              ::operator*(&__end7);
                if ((wc != (InstructionWithCode *)0x0) &&
                   ((InstructionWithCode *)pTStack_138->inst == wc)) {
                  *(undefined1 *)((long)&__range7 + (ulong)(uint)__range7 + 6) = 1;
                }
                __gnu_cxx::
                __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                ::operator++(&__end7);
              }
            }
          }
          if (((__range7._6_1_ & 1) != 0) && ((__range7._7_1_ & 1) != 0)) break;
          if ((__range7._6_1_ & 1) != 0) {
            local_ac = local_ac + 1;
          }
        }
        wc = (InstructionWithCode *)next;
        pTVar7 = Vec<Hpipe::Transition>::operator[](&next->prev,0);
        next = pTVar7->inst;
      }
    }
    for (item._4_4_ = 0; uVar6 = (ulong)item._4_4_,
        sVar8 = std::
                vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                ::size(&(local_18->code_seq_end).
                        super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                      ), uVar6 < sVar8; item._4_4_ = item._4_4_ + 1) {
      pCStack_148 = Vec<Hpipe::InstructionRewind::CodeSeqItem>::operator[]
                              (&local_18->code_seq_end,item._4_4_);
      if (((pCStack_148->offset != 0) &&
          (uVar3 = (*(pCStack_148->code->super_Instruction)._vptr_Instruction[0x1b])(),
          (uVar3 & 1) != 0)) &&
         ((item._4_4_ == 0 ||
          (pCVar9 = Vec<Hpipe::InstructionRewind::CodeSeqItem>::operator[]
                              (&local_18->code_seq_end,item._4_4_ - 1),
          pCVar9->offset < pCStack_148->offset)))) {
        iVar4 = (*(pCStack_148->code->super_Instruction)._vptr_Instruction[0x1c])
                          (pCStack_148->code,&this->inst_pool);
        pCStack_148->code = (InstructionWithCode *)CONCAT44(extraout_var,iVar4);
        pCStack_148->offset = pCStack_148->offset + -1;
      }
    }
    ncx_beg._4_4_ = 0;
    next_rw = local_18->exec;
    while( true ) {
      sVar8 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                        (&(next_rw->prev).
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
      if ((ulong)(long)(int)((next_rw != local_18->exec) + 1) <= sVar8) break;
      __range2._4_4_ = 0;
      __end2 = std::
               vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
               ::begin(&(next_rw->next_rw).
                        super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                      );
      n = (Vec<Hpipe::Transition> *)
          std::
          vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>::
          end(&(next_rw->next_rw).
               super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
             );
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<Hpipe::Vec<Hpipe::Transition>_*,_std::vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>_>
                                         *)&n), bVar2) {
        pvVar10 = &__gnu_cxx::
                   __normal_iterator<Hpipe::Vec<Hpipe::Transition>_*,_std::vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>_>
                   ::operator*(&__end2)->
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>;
        __end3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin(pvVar10);
        t_1 = (Transition *)
              std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end(pvVar10);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                                           *)&t_1), bVar2) {
          wc_1 = (InstructionWithCode *)
                 __gnu_cxx::
                 __normal_iterator<const_Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                 ::operator*(&__end3);
          if ((Instruction *)(wc_1->super_Instruction)._vptr_Instruction != (Instruction *)0x0) {
            pIStack_168 = (Instruction *)(wc_1->super_Instruction)._vptr_Instruction;
            __range2._4_4_ = __range2._4_4_ + 1;
          }
          __gnu_cxx::
          __normal_iterator<const_Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
          ::operator++(&__end3);
        }
        __gnu_cxx::
        __normal_iterator<Hpipe::Vec<Hpipe::Transition>_*,_std::vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>_>
        ::operator++(&__end2);
      }
      if (__range2._4_4_ != 1) break;
      if (next_rw == (Instruction *)0x0) {
        local_3c0 = (InstructionWithCode *)0x0;
      }
      else {
        local_3c0 = (InstructionWithCode *)
                    __dynamic_cast(next_rw,&Instruction::typeinfo,&InstructionWithCode::typeinfo,0);
      }
      local_1b8 = local_3c0;
      if (local_3c0 != (InstructionWithCode *)0x0) {
        if ((local_3c0->in_code_seq & 1U) != 0) break;
        sVar8 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::size
                          ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            *)&(local_3c0->super_Instruction).cx);
        if (1 < sVar8) {
          local_18->offset_ncx = ncx_beg._4_4_;
          local_18->need_rw = true;
          break;
        }
        pVVar5 = &local_18->code_seq_beg;
        uVar3 = (*(local_1b8->super_Instruction)._vptr_Instruction[0x11])();
        if ((uVar3 & 1) == 0) {
          local_3cc = 0xffffffff;
        }
        else {
          local_3cc = ncx_beg._4_4_;
        }
        nc_1._4_4_ = local_3cc;
        std::
        vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
        ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>
                  ((vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                    *)pVVar5,(uint *)((long)&nc_1 + 4),&local_1b8);
        local_1b8->in_code_seq = true;
      }
      if (next_rw == (Instruction *)0x0) {
        local_3e0 = 0;
      }
      else {
        local_3e0 = __dynamic_cast(next_rw,&Instruction::typeinfo,&InstructionNextChar::typeinfo,0);
      }
      local_1c8 = local_3e0;
      if ((local_3e0 != 0) && ((*(byte *)(local_3e0 + 0x174) & 1) == 0)) {
        pvVar10 = &Vec<Hpipe::Vec<Hpipe::Transition>_>::operator[]
                             ((Vec<Hpipe::Vec<Hpipe::Transition>_> *)(local_3e0 + 0xf0),0)->
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>;
        sVar8 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size(pvVar10);
        if (sVar8 != 0) {
          ncx_beg._4_4_ = ncx_beg._4_4_ + 1;
        }
      }
      next_rw = pIStack_168;
    }
    pIVar1 = local_18->exec;
    local_1f8.rewind = &local_18;
    local_1f8.offset_beg = (uint *)((long)&ncx_beg + 4);
    std::function<void(Hpipe::Instruction*)>::
    function<Hpipe::InstructionGraph::make_rewind_data(Hpipe::InstructionRewind*)::__1,void>
              ((function<void(Hpipe::Instruction*)> *)&local_1e8,&local_1f8);
    Instruction::apply_rw(pIVar1,&local_1e8,false);
    std::function<void_(Hpipe::Instruction_*)>::~function(&local_1e8);
    if ((local_18->need_rw & 1U) == 0) {
      Context::without_mark((PC *)&__range1,&(local_18->super_Instruction).cx);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=
                (&local_18->ncx,(type)&__range1);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair
                ((pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)&__range1);
    }
    else {
      Context::without_mark(&local_280,&next_rw->cx);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=(&local_18->ncx,&local_280);
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&local_280);
    }
    pVVar5 = &local_18->code_seq_beg;
    __end1 = std::
             vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             ::begin(&pVVar5->
                      super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                    );
    csi = (CodeSeqItem *)
          std::
          vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
          ::end(&pVVar5->
                 super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
               );
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Hpipe::InstructionRewind::CodeSeqItem_*,_std::vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>_>
                                       *)&csi), bVar2) {
      pCVar11 = __gnu_cxx::
                __normal_iterator<Hpipe::InstructionRewind::CodeSeqItem_*,_std::vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>_>
                ::operator*(&__end1);
      (*(pCVar11->code->super_Instruction)._vptr_Instruction[0x1a])
                (pCVar11->code,&(local_18->super_Instruction).running_strs);
      if (pCVar11->code == (InstructionWithCode *)0x0) {
        local_400 = 0;
      }
      else {
        local_400 = __dynamic_cast(pCVar11->code,&InstructionWithCode::typeinfo,
                                   &InstructionBegStr::typeinfo,0);
      }
      if (local_400 == 0) {
        if (pCVar11->code == (InstructionWithCode *)0x0) {
          local_410 = 0;
        }
        else {
          local_410 = __dynamic_cast(pCVar11->code,&InstructionWithCode::typeinfo,
                                     &InstructionEndStr::typeinfo,0);
        }
        if (local_410 != 0) {
          Context::rem_string(&(local_18->ncx).first,(string *)(local_410 + 0x188));
        }
      }
      else {
        Context::add_string(&(local_18->ncx).first,(string *)(local_400 + 0x188),
                            *(uint *)(local_400 + 0x174));
      }
      __gnu_cxx::
      __normal_iterator<Hpipe::InstructionRewind::CodeSeqItem_*,_std::vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>_>
      ::operator++(&__end1);
    }
    if ((local_18->need_rw & 1U) == 0) {
      sVar8 = std::
              vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
              ::size(&(local_18->code_seq_end).
                      super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                    );
      csi_1._4_4_ = (uint)sVar8;
      while (uVar3 = csi_1._4_4_ - 1, csi_1._4_4_ != 0) {
        pCVar9 = Vec<Hpipe::InstructionRewind::CodeSeqItem>::operator[]
                           (&local_18->code_seq_end,uVar3);
        (*(pCVar9->code->super_Instruction)._vptr_Instruction[0x1a])
                  (pCVar9->code,&(local_18->super_Instruction).running_strs);
        if (pCVar9->code == (InstructionWithCode *)0x0) {
          local_420 = 0;
        }
        else {
          local_420 = __dynamic_cast(pCVar9->code,&InstructionWithCode::typeinfo,
                                     &InstructionBegStr::typeinfo,0);
        }
        csi_1._4_4_ = uVar3;
        if (local_420 == 0) {
          if (pCVar9->code == (InstructionWithCode *)0x0) {
            local_430 = 0;
          }
          else {
            local_430 = __dynamic_cast(pCVar9->code,&InstructionWithCode::typeinfo,
                                       &InstructionEndStr::typeinfo,0);
          }
          if (local_430 != 0) {
            Context::rem_string(&(local_18->ncx).first,(string *)(local_430 + 0x188));
          }
        }
        else {
          Context::add_string(&(local_18->ncx).first,(string *)(local_420 + 0x188),
                              *(uint *)(local_420 + 0x174));
        }
      }
    }
  }
  return;
}

Assistant:

void InstructionGraph::make_rewind_data( InstructionRewind *rewind ) {
    make_rewind_exec( rewind->mark, rewind );

    if ( ! rewind->exec ) {
        rewind->ncx = rewind->cx.without_mark();
        return;
    }

    // read instructions from the end (from OK instruction) until undecidabitity
    InstructionOK *ok = 0;
    unsigned offset_end = 0;
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionOK *tr = dynamic_cast<InstructionOK *>( inst ) )
            ok = tr;
    } );
    if ( ok ) {
        for( Instruction *inst = ok, *next = nullptr; ; ) {
            // if in a loop, stop here
            if ( inst->nb_next_rw() >= 1 + bool( inst != ok ) )
                break;

            // some code to register ?
            if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
                // if ambiguity, on a code, we stop here, to let the beg seq take care of it (with a rewind)
                if ( wc->cx.pos.size() >= 2 )
                    break;
                rewind->code_seq_end.emplace_back( wc->data_code() ? offset_end : -1, wc );
                wc->in_code_seq = true;
            }

            // several choices or end ?
            if ( inst->prev.size() != 1 )
                break;

            // advance
            if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
                if ( nc->beg == false ) {
                    bool in[ 2 ] = { false, false }; // in ok, in ko
                    for( unsigned nt = 0; nt < 2; ++nt ) {
                        if ( nt < nc->next_rw.size() ) {
                            for( const Transition &t : nc->next_rw[ nt ] )
                                if ( next && t.inst == next )
                                    in[ nt ] = true;
                        }
                    }
                    // if OK and KO are possible, we don't know if we have to advance or not
                    if ( in[ 0 ] && in[ 1 ] )
                        break;
                    if ( in[ 0 ] )
                        ++offset_end;
                }
            }

            // loop
            next = inst;
            inst = inst->prev[ 0 ].inst;
        }
    }

    // replace _next instruction to non next versions if possible
    for( unsigned num_item = 0; num_item < rewind->code_seq_end.size(); ++num_item ) {
        InstructionRewind::CodeSeqItem &item = rewind->code_seq_end[ num_item ];
        if ( item.offset && item.code->works_on_next() && ( num_item == 0 || rewind->code_seq_end[ num_item - 1 ].offset < item.offset ) ) {
            item.code = item.code->no_works_on_next_clone( inst_pool );
            --item.offset;
        }
    }

    // read instructions from the beginning, until undecidability
    unsigned offset_beg = 0;
    const Context *ncx_beg = 0;
    for( Instruction *inst = rewind->exec; ; ) {
        ncx_beg = &inst->cx;

        // if in a loop, stop here
        if ( inst->prev.size() >= 1 + bool( inst != rewind->exec ) )
            break;

        // several choices / undecidability or no next
        Instruction *next_rw;
        unsigned nb_next_rw = 0;
        for( const Vec<Transition> &n : inst->next_rw ) {
            for( const Transition &t : n ) {
                if ( t.inst ) {
                    next_rw = t.inst;
                    ++nb_next_rw;
                }
            }
        }
        if ( nb_next_rw != 1 )
            break;

        // some code to register ?
        if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
            // already handled by code_seq_end
            if ( wc->in_code_seq )
                break;
            // if ambiguity, we make a rewind on wc
            if ( wc->cx.pos.size() >= 2 ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
                break;
            }
            // else, register in code_seq_beg
            rewind->code_seq_beg.emplace_back( wc->data_code() ? offset_beg : -1, wc );
            wc->in_code_seq = true;
        }

        // advance
        if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
            if ( nc->beg == false && nc->next_rw[ 0 ].size() )
                ++offset_beg;
        }

        //
        inst = next_rw;
    }

    // test if there are some instructions between code_seq_beg and code_seq_end
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionWithCode *code = dynamic_cast<InstructionWithCode *>( inst ) ) {
            if ( ! code->in_code_seq ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
            }
        }
    } );

    // restart context
    if ( rewind->need_rw )
        rewind->ncx = ncx_beg->without_mark();
    else
        rewind->ncx = rewind->cx.without_mark();

    // stuff that may change the restart context
    for( const InstructionRewind::CodeSeqItem &csi : rewind->code_seq_beg ) {
        csi.code->update_running_strings( rewind->running_strs );

        if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
            rewind->ncx.first.add_string( bs->var, bs->num_active_item );
        else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
            rewind->ncx.first.rem_string( es->var );
    }
    if ( ! rewind->need_rw ) {
        for( unsigned i = rewind->code_seq_end.size(); i--; ) {
            const InstructionRewind::CodeSeqItem &csi = rewind->code_seq_end[ i ];
            csi.code->update_running_strings( rewind->running_strs );

            if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
                rewind->ncx.first.add_string( bs->var, bs->num_active_item );
            else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
                rewind->ncx.first.rem_string( es->var );
        }

    }

    //    // add save point, remove mark if possible
    //    for( InstructionMark *mark : marks ) {
    //        // make rewind->exec, update flags for mark
    //        bool remove_mark = true;
    //        unsigned num_save = 0;
    //        for( InstructionRewind *rewind : mark->rewinds ) {
    //            if ( rewind->need_rw )
    //                remove_mark = false;
    //            else if ( rewind->code_seq.size() ) {
    //                // add save points
    //                for( InstructionWithCode *code : rewind->code_seq ) {
    //                    if ( not code->data_code() )
    //                        continue;
    //                    Instruction *orig = code->orig;
    //                    while ( orig->prev.size() == 1 and dynamic_cast<InstructionWithCode *>( orig->prev[ 0 ].inst ) )
    //                        orig = orig->prev[ 0 ].inst;
    //                    if ( orig->prev.size() == 1 and dynamic_cast<InstructionSave *>( orig->prev[ 0 ].inst ) ) {
    //                        code->save = static_cast<InstructionSave *>( orig->prev[ 0 ].inst );
    //                        continue;
    //                    }
    //                    code->save = inst_pool << new InstructionSave( orig->cx, num_save++ );
    //                    orig->insert_before_this( code->save, init );
    //                    // code->save->mark = mark;
    //                }
    //            }
    //        }
}